

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double __thiscall ON_PlaneEquation::MaximumCoefficient(ON_PlaneEquation *this)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ABS(this->y);
  if (ABS(this->y) <= ABS(this->x)) {
    dVar1 = ABS(this->x);
  }
  dVar2 = ABS(this->z);
  if (ABS(this->z) <= dVar1) {
    dVar2 = dVar1;
  }
  dVar1 = ABS(this->d);
  if (ABS(this->d) <= dVar2) {
    dVar1 = dVar2;
  }
  return dVar1;
}

Assistant:

double ON_PlaneEquation::MaximumCoefficient() const
{
  double m = fabs(x);
  if (fabs(y) > m)
    m = fabs(y);
  if (fabs(z) > m)
    m = fabs(z);
  if (fabs(d) > m)
    m = fabs(d);
  return m;
}